

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O2

ValueHolder * __thiscall
testing::internal::
CheckedDowncastToActualType<testing::internal::ThreadLocal<std::vector<testing::internal::TraceInfo,std::allocator<testing::internal::TraceInfo>>>::ValueHolder,testing::internal::ThreadLocalValueHolderBase>
          (internal *this,ThreadLocalValueHolderBase *base)

{
  _func_int **__s1;
  bool bVar1;
  int iVar2;
  ValueHolder *pVVar3;
  undefined8 uVar4;
  undefined4 extraout_var;
  GTestLog local_14;
  
  if (this != (internal *)0x0) {
    bVar1 = std::type_info::operator==
                      (*(type_info **)(*(long *)this + -8),
                       (type_info *)
                       &ThreadLocal<std::vector<testing::internal::TraceInfo,std::allocator<testing::internal::TraceInfo>>>
                        ::ValueHolder::typeinfo);
    if (!bVar1) {
      GTestLog::GTestLog(&local_14,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/third_party/gtest/googletest/include/gtest/internal/gtest-port.h"
                         ,0x5ee);
      std::operator<<((ostream *)&std::cerr,"Condition typeid(*base) == typeid(Derived) failed. ");
      GTestLog::~GTestLog(&local_14);
    }
    pVVar3 = (ValueHolder *)
             __dynamic_cast(this,&ThreadLocalValueHolderBase::typeinfo,
                            &ThreadLocal<std::vector<testing::internal::TraceInfo,std::allocator<testing::internal::TraceInfo>>>
                             ::ValueHolder::typeinfo,0);
    return pVVar3;
  }
  uVar4 = __cxa_bad_typeid();
  __s1 = *(_func_int ***)(this + 8);
  if (__s1 != base[1]._vptr_ThreadLocalValueHolderBase) {
    if (*(char *)__s1 == '*') {
      return (ValueHolder *)0x0;
    }
    iVar2 = strcmp((char *)__s1,(char *)base[1]._vptr_ThreadLocalValueHolderBase);
    return (ValueHolder *)CONCAT71((int7)(CONCAT44(extraout_var,iVar2) >> 8),iVar2 == 0);
  }
  return (ValueHolder *)CONCAT71((int7)((ulong)uVar4 >> 8),1);
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
#if GTEST_HAS_RTTI
  GTEST_CHECK_(typeid(*base) == typeid(Derived));
#endif

#if GTEST_HAS_DOWNCAST_
  return ::down_cast<Derived*>(base);
#elif GTEST_HAS_RTTI
  return dynamic_cast<Derived*>(base);  // NOLINT
#else
  return static_cast<Derived*>(base);  // Poor man's downcast.
#endif
}